

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_file.c
# Opt level: O0

void lu_file_empty(lu_int nlines,lu_int *begin,lu_int *end,lu_int *next,lu_int *prev,lu_int fmem)

{
  lu_int i;
  lu_int fmem_local;
  lu_int *prev_local;
  lu_int *next_local;
  lu_int *end_local;
  lu_int *begin_local;
  lu_int nlines_local;
  
  begin[nlines] = 0;
  end[nlines] = fmem;
  for (i = 0; i < nlines; i = i + 1) {
    end[i] = 0;
    begin[i] = 0;
  }
  for (i = 0; i < nlines; i = i + 1) {
    next[i] = i + 1;
    prev[i + 1] = i;
  }
  next[nlines] = 0;
  *prev = nlines;
  return;
}

Assistant:

void lu_file_empty(
    lu_int nlines, lu_int *begin, lu_int *end, lu_int *next, lu_int *prev,
    lu_int fmem)
{
    lu_int i;

    begin[nlines] = 0;
    end[nlines] = fmem;
    for (i = 0; i < nlines; i++)
        begin[i] = end[i] = 0;
    for (i = 0; i < nlines; i++)
    {
        next[i] = i+1;
        prev[i+1] = i;
    }
    next[nlines] = 0;
    prev[0] = nlines;
}